

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_wString __thiscall
ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness *this,bool bOrderMinToMax)

{
  float fVar1;
  float fVar2;
  byte in_DL;
  undefined7 in_register_00000031;
  float *pfVar3;
  ulong uVar4;
  double sharpness;
  ON_SubDEdgeSharpness local_30;
  ON_wString local_28;
  ON_SubDEdgeSharpness local_20;
  ON_wString local_18;
  double local_10;
  
  pfVar3 = (float *)CONCAT71(in_register_00000031,bOrderMinToMax);
  fVar1 = *pfVar3;
  if ((((fVar1 < 0.0) || (4.0 < fVar1)) || (fVar2 = pfVar3[1], fVar2 < 0.0)) || (4.0 < fVar2)) {
    if (((fVar1 != 5.0) || (pfVar3[1] != 5.0)) || (sharpness = 5.0, NAN(pfVar3[1]))) {
      sharpness = ON_DBL_QNAN;
    }
  }
  else {
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      uVar4 = 0;
      if (in_DL != 0) {
        uVar4 = (ulong)(fVar2 < fVar1);
      }
      local_10 = (double)pfVar3[(byte)(fVar2 < fVar1 & in_DL ^ 1)];
      ToPercentageText(&local_20,(double)pfVar3[uVar4]);
      ON_wString::ON_wString(&local_28,"-");
      ON_wString::operator+(&local_18,(ON_wString *)&local_20);
      ToPercentageText(&local_30,local_10);
      ON_wString::operator+((ON_wString *)this,&local_18);
      ON_wString::~ON_wString((ON_wString *)&local_30);
      ON_wString::~ON_wString(&local_18);
      ON_wString::~ON_wString(&local_28);
      ON_wString::~ON_wString((ON_wString *)&local_20);
      return (ON_wString)(wchar_t *)this;
    }
    sharpness = (double)fVar1;
  }
  ToPercentageText(this,sharpness);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDEdgeSharpness::ToPercentageText(bool bOrderMinToMax) const
{
  if (IsValid())
  {
    if ( IsConstant() )
      return ON_SubDEdgeSharpness::ToPercentageText(EndSharpness(0));
    const int i0 = (bOrderMinToMax && (EndSharpness(0) > EndSharpness(1))) ? 1 : 0;
    const double s0 = EndSharpness(i0);
    const double s1 = EndSharpness(1-i0);
    return
      ON_SubDEdgeSharpness::ToPercentageText(s0)
      + ON_wString("-")
      + ON_SubDEdgeSharpness::ToPercentageText(s1);
  }

  if (IsCrease())
    return ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness::CreaseValue);

  // invalid sharpness
  return ON_SubDEdgeSharpness::ToPercentageText(ON_DBL_QNAN);
}